

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O0

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::EndObject(PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,SizeType memberCount)

{
  bool bVar1;
  Level *pLVar2;
  undefined4 in_ESI;
  long in_RDI;
  undefined1 uVar3;
  bool ret;
  bool empty;
  undefined2 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff2;
  
  pLVar2 = internal::Stack<rapidjson::CrtAllocator>::
           Pop<rapidjson::Writer<rapidjson::BasicOStreamWrapper<std::ostream>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                     ((Stack<rapidjson::CrtAllocator> *)(in_RDI + 8),1);
  uVar3 = pLVar2->valueCount == 0;
  if (!(bool)uVar3) {
    BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
              ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
               CONCAT44(in_ESI,CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffff2,
                                                       in_stack_fffffffffffffff0))),
               (Ch)((ulong)in_RDI >> 0x38));
    WriteIndent((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)CONCAT44(in_ESI,CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffff2,
                                                           in_stack_fffffffffffffff0))));
  }
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::WriteEndObject((Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    *)0x3afd1b);
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndValue((Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)CONCAT44(in_ESI,CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffff2,
                                                        in_stack_fffffffffffffff0))),
             SUB81((ulong)in_RDI >> 0x38,0));
  bVar1 = internal::Stack<rapidjson::CrtAllocator>::Empty
                    ((Stack<rapidjson::CrtAllocator> *)(in_RDI + 8));
  if (bVar1) {
    Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Flush((Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)0x3afd4c);
  }
  return true;
}

Assistant:

bool EndObject(SizeType memberCount = 0) {
        (void)memberCount;
        RAPIDJSON_ASSERT(Base::level_stack_.GetSize() >= sizeof(typename Base::Level)); // not inside an Object
        RAPIDJSON_ASSERT(!Base::level_stack_.template Top<typename Base::Level>()->inArray); // currently inside an Array, not Object
        RAPIDJSON_ASSERT(0 == Base::level_stack_.template Top<typename Base::Level>()->valueCount % 2); // Object has a Key without a Value
       
        bool empty = Base::level_stack_.template Pop<typename Base::Level>(1)->valueCount == 0;

        if (!empty) {
            Base::os_->Put('\n');
            WriteIndent();
        }
        bool ret = Base::EndValue(Base::WriteEndObject());
        (void)ret;
        RAPIDJSON_ASSERT(ret == true);
        if (Base::level_stack_.Empty()) // end of json text
            Base::Flush();
        return true;
    }